

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestCase *pTVar2;
  pointer pcVar3;
  IStreamingReporter *pIVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  pointer pSVar8;
  pointer pSVar9;
  bool _missingAssertions;
  uint uVar10;
  long lVar11;
  long lVar12;
  pointer this_00;
  Counts assertions;
  SectionInfo testCaseSection;
  SectionStats testCaseSectionStats;
  Counts local_128;
  SectionInfo local_108;
  RedirectedStreams local_b8;
  
  pTVar2 = this->m_activeTestCase;
  local_108.name._M_dataplus._M_p = (pointer)&local_108.name.field_2;
  pcVar3 = (pTVar2->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + (pTVar2->super_TestCaseInfo).name._M_string_length
            );
  paVar1 = &local_108.description.field_2;
  local_108.description._M_string_length = 0;
  local_108.description.field_2._M_local_buf[0] = '\0';
  local_108.lineInfo.file._0_4_ = *(undefined4 *)&(pTVar2->super_TestCaseInfo).lineInfo.file;
  local_108.lineInfo.file._4_4_ =
       *(undefined4 *)((long)&(pTVar2->super_TestCaseInfo).lineInfo.file + 4);
  local_108.lineInfo.line._0_4_ = (undefined4)(pTVar2->super_TestCaseInfo).lineInfo.line;
  local_108.lineInfo.line._4_4_ =
       *(undefined4 *)((long)&(pTVar2->super_TestCaseInfo).lineInfo.line + 4);
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_108.description._M_dataplus._M_p = (pointer)paVar1;
  (*pIVar4->_vptr_IStreamingReporter[8])(pIVar4,&local_108);
  sVar5 = (this->m_totals).assertions.passed;
  sVar6 = (this->m_totals).assertions.failed;
  sVar7 = (this->m_totals).assertions.failedButOk;
  this->m_shouldReportUnexpected = true;
  local_b8.m_redirectedCout = (string *)(pTVar2->super_TestCaseInfo).lineInfo.file;
  local_b8.m_redirectedCerr = (string *)(pTVar2->super_TestCaseInfo).lineInfo.line;
  (this->m_lastAssertionInfo).macroName.m_start = "TEST_CASE";
  (this->m_lastAssertionInfo).macroName.m_size = 9;
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_b8.m_redirectedCout;
  (this->m_lastAssertionInfo).lineInfo.line = (size_t)local_b8.m_redirectedCerr;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  seedRng((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr);
  uVar10 = (*((this->m_reporter)._M_t.
              super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
              ._M_t.
              super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
              .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
             _vptr_IStreamingReporter[2])();
  if ((uVar10 & 1) == 0) {
    lVar11 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
  }
  else {
    RedirectedStreams::RedirectedStreams(&local_b8,redirectedCout,redirectedCerr);
    lVar11 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams(&local_b8);
  }
  lVar12 = std::chrono::_V2::system_clock::now();
  local_128.passed = (this->m_totals).assertions.passed - sVar5;
  local_128.failed = (this->m_totals).assertions.failed - sVar6;
  local_128.failedButOk = (this->m_totals).assertions.failedButOk - sVar7;
  _missingAssertions = testForMissingAssertions(this,&local_128);
  (*this->m_testCaseTracker->_vptr_ITracker[8])();
  handleUnfinishedSections(this);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            (&this->m_messages);
  pSVar8 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar9 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar8;
  if (pSVar9 != pSVar8) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar9);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar8;
  }
  SectionStats::SectionStats
            ((SectionStats *)&local_b8,&local_108,&local_128,
             (double)((ulong)(lVar12 - lVar11) / 1000) / 1000000.0,_missingAssertions);
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar4->_vptr_IStreamingReporter[0xb])(pIVar4,&local_b8);
  SectionStats::~SectionStats((SectionStats *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
    operator_delete(local_108.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        seedRng(*m_config);

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }